

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O1

Image * __thiscall
teetime::Image::resize(Image *__return_storage_ptr__,Image *this,size_t width,size_t height)

{
  stbir_colorspace in_EAX;
  int iVar1;
  Rgba *pRVar2;
  
  pRVar2 = (Rgba *)operator_new__(-(ulong)(height * width >> 0x3e != 0) | height * width * 4);
  __return_storage_ptr__->m_width = 0;
  __return_storage_ptr__->m_height = 0;
  __return_storage_ptr__->m_data = (Rgba *)0x0;
  (__return_storage_ptr__->m_filename)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_filename).field_2;
  (__return_storage_ptr__->m_filename)._M_string_length = 0;
  (__return_storage_ptr__->m_filename).field_2._M_local_buf[0] = '\0';
  iVar1 = stbir__resize_arbitrary
                    (this->m_data,(void *)(ulong)(uint)this->m_width,(int)this->m_height,0,
                     (int)pRVar2,(void *)(width & 0xffffffff),(int)height,0,0,0.0,0.0,1.0,1.0,
                     (float *)0x4,-1,0,0,STBIR_TYPE_UINT8,STBIR_FILTER_DEFAULT,STBIR_FILTER_BOX,
                     STBIR_EDGE_CLAMP,0,in_EAX);
  if (iVar1 != 0) {
    __return_storage_ptr__->m_data = pRVar2;
    __return_storage_ptr__->m_width = width;
    __return_storage_ptr__->m_height = height;
    pRVar2 = (Rgba *)0x0;
  }
  if (pRVar2 != (Rgba *)0x0) {
    operator_delete__(pRVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

Image Image::resize(size_t width, size_t height) const
{
  unique_ptr<Rgba[]> p(new Rgba[width * height]);

  Image image;

  if (stbir_resize_uint8((const uint8*)m_data, (int)m_width, (int)m_height, 0, (uint8*)p.get(), (int)width, (int)height, 0, 4) != 0)
  {
    image.m_data = p.release();
    image.m_width = width;
    image.m_height = height;
  }

  return image;
}